

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void * base_alloc_impl(tsdn_t *tsdn,base_t *base,size_t size,size_t alignment,size_t *esn)

{
  ulong size_00;
  extent_t *extent_00;
  tsdn_t *tsdn_00;
  size_t sVar1;
  long in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  base_t *in_RDI;
  base_t *in_R8;
  void *ret;
  szind_t i;
  extent_t *extent;
  size_t asize;
  size_t usize;
  szind_t ret_1;
  extent_heap_t *in_stack_00000068;
  void *local_68;
  uint local_5c;
  extent_t *extent_01;
  tsdn_t *ptVar2;
  uint local_10;
  
  size_00 = in_RCX + 0xfU & 0xfffffffffffffff0;
  extent_00 = (extent_t *)(in_RDX + (size_00 - 1) & (size_00 ^ 0xffffffffffffffff) + 1);
  tsdn_00 = (tsdn_t *)((long)extent_00 + (size_00 - 0x10));
  extent_01 = (extent_t *)0x0;
  malloc_mutex_lock((tsdn_t *)extent_00,(malloc_mutex_t *)tsdn_00);
  ptVar2 = tsdn_00;
  if (tsdn_00 < (tsdn_t *)0x1001) {
    local_10 = (uint)sz_size2index_tab[(ulong)((long)&tsdn_00->tsd + 7) >> 3];
  }
  else {
    local_10 = sz_size2index_compute(size_00);
  }
  local_5c = local_10;
  while ((local_5c < 0xe8 &&
         (extent_01 = extent_heap_remove_first(in_stack_00000068), extent_01 == (extent_t *)0x0))) {
    local_5c = local_5c + 1;
  }
  if (extent_01 == (extent_t *)0x0) {
    extent_01 = base_extent_alloc(ptVar2,in_RDI,in_RSI,in_RDX);
  }
  if (extent_01 == (extent_t *)0x0) {
    local_68 = (void *)0x0;
  }
  else {
    local_68 = base_extent_bump_alloc(in_R8,extent_00,(size_t)tsdn_00,(size_t)extent_01);
    if (in_R8 != (base_t *)0x0) {
      sVar1 = extent_sn_get(extent_01);
      *(size_t *)in_R8 = sVar1;
    }
  }
  malloc_mutex_unlock(tsdn_00,(malloc_mutex_t *)extent_01);
  return local_68;
}

Assistant:

static void *
base_alloc_impl(tsdn_t *tsdn, base_t *base, size_t size, size_t alignment,
    size_t *esn) {
	alignment = QUANTUM_CEILING(alignment);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t asize = usize + alignment - QUANTUM;

	extent_t *extent = NULL;
	malloc_mutex_lock(tsdn, &base->mtx);
	for (szind_t i = sz_size2index(asize); i < SC_NSIZES; i++) {
		extent = extent_heap_remove_first(&base->avail[i]);
		if (extent != NULL) {
			/* Use existing space. */
			break;
		}
	}
	if (extent == NULL) {
		/* Try to allocate more space. */
		extent = base_extent_alloc(tsdn, base, usize, alignment);
	}
	void *ret;
	if (extent == NULL) {
		ret = NULL;
		goto label_return;
	}

	ret = base_extent_bump_alloc(base, extent, usize, alignment);
	if (esn != NULL) {
		*esn = extent_sn_get(extent);
	}
label_return:
	malloc_mutex_unlock(tsdn, &base->mtx);
	return ret;
}